

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O3

bool __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::
generic_get_entry_rela<ELFIO::Elf64_Rela>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr *offset,Elf_Word *symbol,uint *type,Elf_Sxword *addend)

{
  bool bVar1;
  elfio *peVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  ulong uVar8;
  long lVar6;
  
  peVar2 = this->elf_file;
  iVar4 = (*this->relocation_section->_vptr_section[0xf])();
  if (0x17 < CONCAT44(extraout_var,iVar4)) {
    iVar5 = (*this->relocation_section->_vptr_section[0x18])();
    lVar6 = CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*this->relocation_section->_vptr_section[0xf])();
    lVar7 = CONCAT44(extraout_var_01,iVar5) * index;
    uVar3 = *(ulong *)(lVar6 + lVar7);
    bVar1 = (peVar2->convertor).need_conversion;
    uVar8 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    if (bVar1 == false) {
      uVar8 = uVar3;
    }
    *offset = uVar8;
    uVar3 = *(ulong *)(lVar6 + 8 + lVar7);
    uVar8 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    if (bVar1 == false) {
      uVar8 = uVar3;
    }
    *symbol = (Elf_Word)(uVar8 >> 0x20);
    *type = (uint)uVar8;
    uVar3 = *(ulong *)(lVar6 + 0x10 + lVar7);
    uVar8 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    if (bVar1 == false) {
      uVar8 = uVar3;
    }
    *addend = uVar8;
  }
  return 0x17 < CONCAT44(extraout_var,iVar4);
}

Assistant:

bool generic_get_entry_rela( Elf_Xword   index,
                                 Elf64_Addr& offset,
                                 Elf_Word&   symbol,
                                 unsigned&   type,
                                 Elf_Sxword& addend ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        if ( relocation_section->get_entry_size() < sizeof( T ) ) {
            return false;
        }

        const T* pEntry = reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() );
        offset        = convertor( pEntry->r_offset );
        Elf_Xword tmp = convertor( pEntry->r_info );
        symbol        = get_sym_and_type<T>::get_r_sym( tmp );
        type          = get_sym_and_type<T>::get_r_type( tmp );
        addend        = convertor( pEntry->r_addend );
        return true;
    }